

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatWatchList.h
# Opt level: O2

void xSAT_WatchListRemove(xSAT_WatchList_t *v,uint CRef)

{
  xSAT_Watcher_t *pxVar1;
  long lVar2;
  long lVar3;
  
  pxVar1 = v->pArray;
  lVar3 = 0;
  do {
    lVar2 = lVar3;
    lVar3 = lVar2 + 1;
  } while (pxVar1[lVar2].CRef != CRef);
  if ((int)lVar2 < v->nSize) {
    memmove(pxVar1 + lVar2,pxVar1 + lVar3,(long)(v->nSize - (int)lVar3) << 3);
    v->nSize = v->nSize + -1;
    return;
  }
  __assert_fail("j < xSAT_WatchListSize( v )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatWatchList.h"
                ,0xab,"void xSAT_WatchListRemove(xSAT_WatchList_t *, unsigned int)");
}

Assistant:

static inline void xSAT_WatchListRemove( xSAT_WatchList_t * v, unsigned CRef )
{
    xSAT_Watcher_t* ws = xSAT_WatchListArray(v);
    int j = 0;

    for ( ; ws[j].CRef != CRef; j++ );
    assert( j < xSAT_WatchListSize( v ) );
    memmove( v->pArray + j, v->pArray + j + 1, ( v->nSize - j - 1 ) * sizeof( xSAT_Watcher_t ) );
    v->nSize -= 1;
}